

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

XrResult ApiDumpLayerXrEnumerateSpatialEntityComponentTypesBD
                   (XrSenseDataSnapshotBD snapshot,XrSpatialEntityIdBD entityId,
                   uint32_t componentTypeCapacityInput,uint32_t *componentTypeCountOutput,
                   XrSpatialEntityComponentTypeBD *componentTypes)

{
  long lVar1;
  XrResult XVar2;
  iterator iVar3;
  ostream *poVar4;
  long lVar5;
  XrSenseDataSnapshotBD snapshot_local;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  ostringstream oss_componentTypeCapacityInput;
  ostringstream oss_componentTypes;
  uint auStack_480 [88];
  ostringstream oss_componentTypeCountOutput;
  uint auStack_308 [88];
  ostringstream oss_snapshot;
  uint auStack_190 [88];
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  snapshot_local = snapshot;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&oss_snapshot,&g_sensedatasnapshotbd_dispatch_mutex);
  iVar3 = std::
          _Hashtable<XrSenseDataSnapshotBD_T_*,_std::pair<XrSenseDataSnapshotBD_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrSenseDataSnapshotBD_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrSenseDataSnapshotBD_T_*>,_std::hash<XrSenseDataSnapshotBD_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&g_sensedatasnapshotbd_dispatch_map._M_h,&snapshot_local);
  if (iVar3.
      super__Node_iterator_base<std::pair<XrSenseDataSnapshotBD_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = *(long *)((long)iVar3.
                            super__Node_iterator_base<std::pair<XrSenseDataSnapshotBD_T_*const,_XrGeneratedDispatchTable_*>,_false>
                            ._M_cur + 0x10);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&oss_snapshot);
  if (iVar3.
      super__Node_iterator_base<std::pair<XrSenseDataSnapshotBD_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[41],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"XrResult",
               (char (*) [41])"xrEnumerateSpatialEntityComponentTypesBD",(char (*) [1])0x20fb54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_snapshot);
    lVar1 = *(long *)((long)&_oss_snapshot[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_190 + lVar1) = *(uint *)((long)auStack_190 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_snapshot);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[22],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [22])"XrSenseDataSnapshotBD",(char (*) [9])"snapshot",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_componentTypeCapacityInput);
    std::__cxx11::string::~string((string *)&oss_componentTypeCapacityInput);
    std::__cxx11::to_string((string *)&oss_componentTypeCapacityInput,entityId);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[20],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [20])"XrSpatialEntityIdBD",(char (*) [9])"entityId",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_componentTypeCapacityInput);
    std::__cxx11::string::~string((string *)&oss_componentTypeCapacityInput);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_componentTypeCapacityInput);
    poVar4 = std::operator<<((ostream *)&oss_componentTypeCapacityInput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[27],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"uint32_t",(char (*) [27])"componentTypeCapacityInput",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_componentTypeCountOutput);
    std::__cxx11::string::~string((string *)&oss_componentTypeCountOutput);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_componentTypeCountOutput);
    *(uint *)((long)auStack_308 + *(long *)(_oss_componentTypeCountOutput + -0x18)) =
         *(uint *)((long)auStack_308 + *(long *)(_oss_componentTypeCountOutput + -0x18)) &
         0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_componentTypeCountOutput);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],char_const(&)[25],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [10])0x2122c1,(char (*) [25])"componentTypeCountOutput",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_componentTypes);
    std::__cxx11::string::~string((string *)&oss_componentTypes);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_componentTypes);
    *(uint *)((long)auStack_480 + *(long *)(_oss_componentTypes + -0x18)) =
         *(uint *)((long)auStack_480 + *(long *)(_oss_componentTypes + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_componentTypes);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[32],char_const(&)[15],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [32])"XrSpatialEntityComponentTypeBD*",
               (char (*) [15])"componentTypes",&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_648,&contents);
    ApiDumpLayerRecordContent(&local_648);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_648);
    XVar2 = (**(code **)(lVar5 + 0x8a0))
                      (snapshot_local,entityId,componentTypeCapacityInput,componentTypeCountOutput,
                       componentTypes);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_componentTypes);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_componentTypeCountOutput);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_componentTypeCapacityInput);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_snapshot);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&contents);
  return XVar2;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrEnumerateSpatialEntityComponentTypesBD(
    XrSenseDataSnapshotBD snapshot,
    XrSpatialEntityIdBD entityId,
    uint32_t componentTypeCapacityInput,
    uint32_t* componentTypeCountOutput,
    XrSpatialEntityComponentTypeBD* componentTypes) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_sensedatasnapshotbd_dispatch_mutex);
            auto map_iter = g_sensedatasnapshotbd_dispatch_map.find(snapshot);
            if (map_iter == g_sensedatasnapshotbd_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrEnumerateSpatialEntityComponentTypesBD", "");
        std::ostringstream oss_snapshot;
        oss_snapshot << std::hex << reinterpret_cast<const void*>(snapshot);
        contents.emplace_back("XrSenseDataSnapshotBD", "snapshot", oss_snapshot.str());
        contents.emplace_back("XrSpatialEntityIdBD", "entityId", std::to_string(entityId));
        std::ostringstream oss_componentTypeCapacityInput;
        oss_componentTypeCapacityInput << "0x" << std::hex << (componentTypeCapacityInput);
        contents.emplace_back("uint32_t", "componentTypeCapacityInput", oss_componentTypeCapacityInput.str());
        std::ostringstream oss_componentTypeCountOutput;
        oss_componentTypeCountOutput << std::hex << (componentTypeCountOutput);
        contents.emplace_back("uint32_t*", "componentTypeCountOutput", oss_componentTypeCountOutput.str());
        std::ostringstream oss_componentTypes;
        oss_componentTypes << std::hex << reinterpret_cast<const void*>(componentTypes);
        contents.emplace_back("XrSpatialEntityComponentTypeBD*", "componentTypes", oss_componentTypes.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->EnumerateSpatialEntityComponentTypesBD(snapshot, entityId, componentTypeCapacityInput, componentTypeCountOutput, componentTypes);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}